

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_checkstack(lua_State *L,int size)

{
  CallInfo *pCVar1;
  uint uVar2;
  int iVar3;
  int local_14;
  
  pCVar1 = L->ci;
  uVar2 = 1;
  local_14 = size;
  if (((long)L->stack_last - (long)L->top >> 4 <= (long)size) &&
     (uVar2 = 0, (int)((ulong)((long)L->top - (long)L->stack) >> 4) + 5 <= 1000000 - size)) {
    iVar3 = luaD_rawrunprotected(L,growstack,&local_14);
    uVar2 = (uint)(iVar3 == 0);
  }
  if ((uVar2 != 0) && (pCVar1->top < L->top + local_14)) {
    pCVar1->top = L->top + local_14;
  }
  return uVar2;
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int size) {
  int res;
  CallInfo *ci = L->ci;
  lua_lock(L);
  if (L->stack_last - L->top > size)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else {  /* no; need to grow stack */
    int inuse = cast_int(L->top - L->stack) + EXTRA_STACK;
    if (inuse > LUAI_MAXSTACK - size)  /* can grow without overflow? */
      res = 0;  /* no */
    else  /* try to grow stack */
      res = (luaD_rawrunprotected(L, &growstack, &size) == LUA_OK);
  }
  if (res && ci->top < L->top + size)
    ci->top = L->top + size;  /* adjust frame top */
  lua_unlock(L);
  return res;
}